

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind6-error.c
# Opt level: O1

int run_test_tcp_bind6_localhost_ok(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  sockaddr_in6 addr;
  uv_tcp_t server;
  undefined1 local_124 [28];
  char local_108 [248];
  
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    run_test_tcp_bind6_localhost_ok_cold_5();
    return 1;
  }
  pcVar3 = "::1";
  iVar1 = uv_ip6_addr("::1",0x23a3,local_124);
  if (iVar1 == 0) {
    pcVar3 = (char *)uv_default_loop();
    iVar1 = uv_tcp_init(pcVar3,local_108);
    if (iVar1 != 0) goto LAB_0017e0f9;
    pcVar3 = local_108;
    iVar1 = uv_tcp_bind(pcVar3,local_124,0);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      pcVar3 = (char *)uv_default_loop();
      iVar1 = uv_loop_close(pcVar3);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0017e103;
    }
  }
  else {
    run_test_tcp_bind6_localhost_ok_cold_1();
LAB_0017e0f9:
    run_test_tcp_bind6_localhost_ok_cold_2();
  }
  run_test_tcp_bind6_localhost_ok_cold_3();
LAB_0017e103:
  run_test_tcp_bind6_localhost_ok_cold_4();
  iVar1 = uv_is_closing();
  if (iVar1 == 0) {
    iVar1 = uv_close(pcVar3,0);
    return iVar1;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_bind6_localhost_ok) {
  struct sockaddr_in6 addr;
  uv_tcp_t server;
  int r;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT(0 == uv_ip6_addr("::1", TEST_PORT, &addr));

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}